

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::IsIgnored
          (MessageDifferencer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  IgnoreCriteria *pIVar3;
  int iVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  bool bVar9;
  
  p_Var1 = &(this->ignored_fields_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->ignored_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0;
      p_Var7 = (&p_Var7->_M_left)[*(FieldDescriptor **)(p_Var7 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var7 + 1) >= field) {
      p_Var5 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var7 = p_Var5, field < *(FieldDescriptor **)(p_Var5 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  bVar9 = true;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    ppIVar2 = (this->ignore_criteria_).
              super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar9 = (this->ignore_criteria_).
            super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppIVar2;
    if ((bVar9) &&
       (pIVar3 = *ppIVar2,
       iVar4 = (*pIVar3->_vptr_IgnoreCriteria[2])(pIVar3,message1,message2,field,parent_fields),
       (char)iVar4 == '\0')) {
      uVar8 = 1;
      do {
        ppIVar2 = (this->ignore_criteria_).
                  super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(this->ignore_criteria_).
                      super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2 >> 3;
        bVar9 = uVar8 < uVar6;
        if (uVar6 <= uVar8) {
          return bVar9;
        }
        pIVar3 = ppIVar2[uVar8];
        iVar4 = (*pIVar3->_vptr_IgnoreCriteria[2])(pIVar3,message1,message2,field,parent_fields);
        uVar8 = uVar8 + 1;
      } while ((char)iVar4 == '\0');
    }
  }
  return bVar9;
}

Assistant:

bool MessageDifferencer::IsIgnored(
    const Message& message1, const Message& message2,
    const FieldDescriptor* field,
    const std::vector<SpecificField>& parent_fields) {
  if (ignored_fields_.find(field) != ignored_fields_.end()) {
    return true;
  }
  for (int i = 0; i < ignore_criteria_.size(); ++i) {
    if (ignore_criteria_[i]->IsIgnored(message1, message2, field,
                                       parent_fields)) {
      return true;
    }
  }
  return false;
}